

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheatSheetTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCheatSheet_foo_TestShell::createTest(TEST_MockCheatSheet_foo_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCheatSheetTest.cpp"
                                  ,0x33);
  TEST_MockCheatSheet_foo_Test::TEST_MockCheatSheet_foo_Test
            ((TEST_MockCheatSheet_foo_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCheatSheet, foo)
{
    /* Record 2 calls to Foo. Return different values on each call */
    mock().expectOneCall("Foo")
        .withParameter("param_string", "value_string")
        .withParameter("param_int", 10)
        .andReturnValue(30);
    mock().expectOneCall("Foo")
        .ignoreOtherParameters()
        .andReturnValue(50);

    /* Call production code */
    productionCodeFooCalls();
}